

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

void floor1_pack(vorbis_info_floor *i,oggpack_buffer *opb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ogg_uint32_t v;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  iVar3 = *(int *)((long)i + 0x348);
  oggpack_write(opb,(long)*i,5);
  if (0 < *i) {
    iVar4 = -1;
    lVar8 = 0;
    do {
      oggpack_write(opb,(long)*(int *)((long)i + lVar8 * 4 + 4),4);
      iVar6 = *(int *)((long)i + lVar8 * 4 + 4);
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      iVar4 = iVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < *i);
    if (-1 < iVar4) {
      lVar8 = (long)i + 0x140;
      uVar9 = 0;
      do {
        oggpack_write(opb,(long)*(int *)((long)i + uVar9 * 4 + 0x80) - 1,3);
        oggpack_write(opb,(long)*(int *)((long)i + uVar9 * 4 + 0xc0),2);
        if (*(int *)((long)i + uVar9 * 4 + 0xc0) == 0) {
LAB_001e01db:
          lVar7 = 0;
          do {
            oggpack_write(opb,(long)*(int *)(lVar8 + lVar7 * 4) + 1,8);
            lVar7 = lVar7 + 1;
          } while (lVar7 < 1 << (*(byte *)((long)i + uVar9 * 4 + 0xc0) & 0x1f));
        }
        else {
          oggpack_write(opb,(long)*(int *)((long)i + uVar9 * 4 + 0x100),8);
          if (*(int *)((long)i + uVar9 * 4 + 0xc0) != 0x1f) goto LAB_001e01db;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar9 != iVar4 + 1);
    }
  }
  oggpack_write(opb,(long)*(int *)((long)i + 0x340) - 1,2);
  v = iVar3 - 1;
  iVar3 = ov_ilog(v);
  oggpack_write(opb,(long)iVar3,4);
  iVar4 = ov_ilog(v);
  iVar3 = *i;
  if (0 < iVar3) {
    lVar8 = 0;
    iVar5 = 0;
    iVar6 = 0;
    do {
      iVar2 = *(int *)((long)i + (long)*(int *)((long)i + lVar8 * 4 + 4) * 4 + 0x80);
      iVar1 = iVar2 + iVar6;
      if (iVar5 < iVar1) {
        lVar7 = 0;
        do {
          oggpack_write(opb,(long)*(int *)((long)i + lVar7 * 4 + (long)iVar5 * 4 + 0x34c),iVar4);
          lVar7 = lVar7 + 1;
        } while ((iVar2 + iVar6) - iVar5 != (int)lVar7);
        iVar3 = *i;
        iVar5 = iVar1;
      }
      lVar8 = lVar8 + 1;
      iVar6 = iVar1;
    } while (lVar8 < iVar3);
  }
  return;
}

Assistant:

static void floor1_pack (vorbis_info_floor *i,oggpack_buffer *opb){
  vorbis_info_floor1 *info=(vorbis_info_floor1 *)i;
  int j,k;
  int count=0;
  int rangebits;
  int maxposit=info->postlist[1];
  int maxclass=-1;

  /* save out partitions */
  oggpack_write(opb,info->partitions,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    oggpack_write(opb,info->partitionclass[j],4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* save out partition classes */
  for(j=0;j<maxclass+1;j++){
    oggpack_write(opb,info->class_dim[j]-1,3); /* 1 to 8 */
    oggpack_write(opb,info->class_subs[j],2); /* 0 to 3 */
    if(info->class_subs[j])oggpack_write(opb,info->class_book[j],8);
    for(k=0;k<(1<<info->class_subs[j]);k++)
      oggpack_write(opb,info->class_subbook[j][k]+1,8);
  }

  /* save out the post list */
  oggpack_write(opb,info->mult-1,2);     /* only 1,2,3,4 legal now */
  /* maxposit cannot legally be less than 1; this is encode-side, we
     can assume our setup is OK */
  oggpack_write(opb,ov_ilog(maxposit-1),4);
  rangebits=ov_ilog(maxposit-1);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    for(;k<count;k++)
      oggpack_write(opb,info->postlist[k+2],rangebits);
  }
}